

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Exception * kj::_::XThreadPaf::unfulfilledException(void)

{
  Exception *in_RDI;
  String local_28;
  
  heapString(&local_28,"cross-thread PromiseFulfiller was destroyed without fulfilling the promise."
            );
  Exception::Exception
            (in_RDI,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x4e5,&local_28);
  String::~String(&local_28);
  return in_RDI;
}

Assistant:

kj::Exception XThreadPaf::unfulfilledException() {
  // TODO(cleanup): Share code with regular PromiseAndFulfiller for stack tracing here.
  return kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__, kj::heapString(
      "cross-thread PromiseFulfiller was destroyed without fulfilling the promise."));
}